

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::rehash
          (Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this,size_t sizeHint)

{
  Entry *pEVar1;
  ulong uVar2;
  Span *pSVar3;
  Chain *pCVar4;
  ulong uVar5;
  Node *pNVar6;
  ulong uVar7;
  Span *pSVar8;
  size_t index;
  long lVar9;
  size_t numBuckets;
  uchar *key;
  long lVar10;
  R RVar11;
  Bucket BVar12;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  this->numBuckets = numBuckets;
  if (uVar2 < 0x80) {
    if (pSVar3 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar7 = 0;
    pSVar8 = pSVar3;
    do {
      lVar9 = 0;
      do {
        if ((ulong)pSVar8->offsets[lVar9] != 0xff) {
          pEVar1 = pSVar3[uVar7].entries + pSVar8->offsets[lVar9];
          key = (pEVar1->storage).data + 0x10;
          uVar5 = *(ulong *)key ^ this->seed;
          uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          BVar12 = findBucketWithHash<unsigned_long_long>
                             (this,(unsigned_long_long *)key,uVar5 >> 0x20 ^ uVar5);
          pNVar6 = Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::insert
                             (BVar12.span,BVar12.index);
          pCVar4 = *(Chain **)((pEVar1->storage).data + 8);
          (pNVar6->super_Chain).prev = *(Chain **)(pEVar1->storage).data;
          (pNVar6->super_Chain).next = pCVar4;
          pNVar6->key = *(unsigned_long_long *)key;
          (pNVar6->value).t = *(QOpenGLCachedTexture **)((pEVar1->storage).data + 0x18);
          (pNVar6->value).cost = *(qsizetype *)((pEVar1->storage).data + 0x20);
          (pEVar1->storage).data[0x18] = '\0';
          (pEVar1->storage).data[0x19] = '\0';
          (pEVar1->storage).data[0x1a] = '\0';
          (pEVar1->storage).data[0x1b] = '\0';
          (pEVar1->storage).data[0x1c] = '\0';
          (pEVar1->storage).data[0x1d] = '\0';
          (pEVar1->storage).data[0x1e] = '\0';
          (pEVar1->storage).data[0x1f] = '\0';
          ((pNVar6->super_Chain).prev)->next = &pNVar6->super_Chain;
          ((pNVar6->super_Chain).next)->prev = &pNVar6->super_Chain;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::freeData(pSVar3 + uVar7);
      uVar7 = uVar7 + 1;
      pSVar8 = pSVar8 + 1;
    } while (uVar7 != uVar2 >> 7);
  }
  lVar9 = *(long *)&pSVar3[-1].allocated;
  if (lVar9 != 0) {
    lVar10 = lVar9 * 0x90;
    do {
      Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::freeData
                ((Span<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *)
                 (pSVar3[-1].offsets + lVar10));
      lVar10 = lVar10 + -0x90;
    } while (lVar10 != 0);
  }
  operator_delete__(&pSVar3[-1].allocated,lVar9 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }